

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamtests.cc
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  ostream *poVar2;
  char *__file;
  undefined8 *in_RSI;
  int in_EDI;
  stat info;
  char **in_stack_ffffffffffffff58;
  int *in_stack_ffffffffffffff60;
  uint local_88;
  
  testing::InitGoogleTest(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  if ((testing::FLAGS_gtest_list_tests & 1) == 0) {
    if (in_EDI != 2) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Usage: ");
      poVar2 = std::operator<<(poVar2,(char *)*in_RSI);
      std::operator<<(poVar2," <test images path>\n");
      return -1;
    }
    std::__cxx11::string::operator=
              ((string *)(anonymous_namespace)::testImagesPath_abi_cxx11_,(char *)in_RSI[1]);
    __file = (char *)std::__cxx11::string::data();
    iVar1 = stat(__file,(stat *)&stack0xffffffffffffff60);
    if (iVar1 != 0) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Cannot access ");
      poVar2 = std::operator<<(poVar2,(string *)(anonymous_namespace)::testImagesPath_abi_cxx11_);
      std::operator<<(poVar2,'\n');
      return -2;
    }
    if ((local_88 & 0x4000) == 0) {
      poVar2 = std::operator<<((ostream *)&std::cerr,
                               (string *)(anonymous_namespace)::testImagesPath_abi_cxx11_);
      std::operator<<(poVar2,"is not a valid directory\n");
      return -3;
    }
  }
  iVar1 = RUN_ALL_TESTS();
  return iVar1;
}

Assistant:

int main(int argc, char **argv)
{
    ::testing::InitGoogleTest(&argc, argv);

    if (!::testing::FLAGS_gtest_list_tests)
    {
        if (argc != 2)
        {
            std::cerr << "Usage: " << argv[0] << " <test images path>\n";
            return -1;
        }

        testImagesPath = argv[1];

        struct stat info;
        if (stat(testImagesPath.data(), &info) != 0)
        {
            std::cerr << "Cannot access " << testImagesPath << '\n';
            return -2;
        }
        else if (!(info.st_mode & S_IFDIR))
        {
            std::cerr << testImagesPath << "is not a valid directory\n";
            return -3;
        }
    }

    return RUN_ALL_TESTS();
}